

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2FindAndConsume(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_ff0;
  StringPiece local_e70;
  LogMessage local_e60;
  RE2 local_ce0;
  StringPiece local_c00;
  LogMessage local_bf0;
  string *local_a70;
  LogMessage local_a68;
  LogMessage local_8e8;
  string *local_768;
  LogMessage local_760;
  LogMessage local_5e0;
  string *local_460;
  LogMessage local_458;
  LogMessage local_2d8;
  string *local_158;
  undefined1 local_150 [8];
  StringPiece input;
  allocator local_129;
  string local_128 [8];
  string s;
  string local_108 [8];
  string word;
  undefined1 local_e8 [8];
  RE2 r;
  
  RE2::RE2((RE2 *)local_e8,"(\\w+)");
  std::__cxx11::string::string(local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"   aaa b!@#$@#$cccc",&local_129);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  StringPiece::StringPiece((StringPiece *)local_150,(string *)local_128);
  local_158 = local_108;
  bVar1 = RE2::FindAndConsume<std::__cxx11::string*>
                    ((StringPiece *)local_150,(RE2 *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_158);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x115);
    poVar2 = LogMessage::stream(&local_2d8);
    std::operator<<(poVar2,"Check failed: RE2::FindAndConsume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2d8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_108,"aaa");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_458,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x116);
    poVar2 = LogMessage::stream(&local_458);
    std::operator<<(poVar2,"Check failed: (word) == (\"aaa\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_458);
  }
  local_460 = local_108;
  bVar1 = RE2::FindAndConsume<std::__cxx11::string*>
                    ((StringPiece *)local_150,(RE2 *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_460);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_5e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x117);
    poVar2 = LogMessage::stream(&local_5e0);
    std::operator<<(poVar2,"Check failed: RE2::FindAndConsume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5e0);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_108,"b");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_760,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x118);
    poVar2 = LogMessage::stream(&local_760);
    std::operator<<(poVar2,"Check failed: (word) == (\"b\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_760);
  }
  local_768 = local_108;
  bVar1 = RE2::FindAndConsume<std::__cxx11::string*>
                    ((StringPiece *)local_150,(RE2 *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_768);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_8e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x119);
    poVar2 = LogMessage::stream(&local_8e8);
    std::operator<<(poVar2,"Check failed: RE2::FindAndConsume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_8e8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_108,"cccc");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a68,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x11a);
    poVar2 = LogMessage::stream(&local_a68);
    std::operator<<(poVar2,"Check failed: (word) == (\"cccc\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a68);
  }
  local_a70 = local_108;
  bVar1 = RE2::FindAndConsume<std::__cxx11::string*>
                    ((StringPiece *)local_150,(RE2 *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_a70);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_bf0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x11b);
    poVar2 = LogMessage::stream(&local_bf0);
    std::operator<<(poVar2,"Check failed: ! RE2::FindAndConsume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_bf0);
  }
  StringPiece::StringPiece(&local_c00,"aaa");
  input.ptr_._0_4_ = local_c00.length_;
  local_150 = (undefined1  [8])local_c00.ptr_;
  RE2::RE2(&local_ce0,"aaa");
  bVar1 = RE2::FindAndConsume<>((StringPiece *)local_150,&local_ce0);
  RE2::~RE2(&local_ce0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e60,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x121);
    poVar2 = LogMessage::stream(&local_e60);
    std::operator<<(poVar2,"Check failed: RE2::FindAndConsume(&input, \"aaa\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e60);
  }
  StringPiece::StringPiece(&local_e70,"");
  bVar1 = operator==((StringPiece *)local_150,&local_e70);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_ff0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x122);
    poVar2 = LogMessage::stream(&local_ff0);
    std::operator<<(poVar2,"Check failed: (input) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_ff0);
  }
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_108);
  RE2::~RE2((RE2 *)local_e8);
  return;
}

Assistant:

TEST(RE2, FindAndConsume) {
  VLOG(1) << "TestFindAndConsume";

  RE2 r("(\\w+)");      // matches a word
  string word;

  string s("   aaa b!@#$@#$cccc");
  StringPiece input(s);

  CHECK(RE2::FindAndConsume(&input, r, &word));
  CHECK_EQ(word, "aaa");
  CHECK(RE2::FindAndConsume(&input, r, &word));
  CHECK_EQ(word, "b");
  CHECK(RE2::FindAndConsume(&input, r, &word));
  CHECK_EQ(word, "cccc");
  CHECK(! RE2::FindAndConsume(&input, r, &word));

  // Check that FindAndConsume works without any submatches.
  // Earlier version used uninitialized data for
  // length to consume.
  input = "aaa";
  CHECK(RE2::FindAndConsume(&input, "aaa"));
  CHECK_EQ(input, "");
}